

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directory.cpp
# Opt level: O0

String * Directory::getTempDirectory(void)

{
  String *in_RDI;
  
  String::String<5ul>(in_RDI,(char (*) [5])"/tmp");
  return in_RDI;
}

Assistant:

String Directory::getTempDirectory()
{
#ifdef _WIN32
  char buffer[MAX_PATH + 2];
  DWORD len = GetTempPath(MAX_PATH + 2, buffer);
  if(len == 0)
    return String();
  while(len > 1 && buffer[len - 1] == '\\')
    --len;
  return String(buffer, len);
#else
  return String("/tmp");
#endif
}